

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MultiFabUtil.cpp
# Opt level: O2

void amrex::average_face_to_cellcenter(MultiFab *cc,Array<const_MultiFab_*,_3> *fc,Geometry *geom)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  int local_2d4;
  Box bx;
  Array4<double> local_208;
  Array4<const_double> local_1c8;
  Array4<const_double> local_188;
  Array4<const_double> local_148;
  MFIter mfi;
  GeometryData gd;
  
  Geometry::data(geom);
  MFIter::MFIter(&mfi,(FabArrayBase *)cc,true);
  while (mfi.currentIndex < mfi.endIndex) {
    MFIter::tilebox(&bx,&mfi);
    FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              (&local_208,&cc->super_FabArray<amrex::FArrayBox>,&mfi);
    FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
              (&local_148,&fc->_M_elems[0]->super_FabArray<amrex::FArrayBox>,&mfi);
    FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
              (&local_188,&fc->_M_elems[1]->super_FabArray<amrex::FArrayBox>,&mfi);
    FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
              (&local_1c8,&fc->_M_elems[2]->super_FabArray<amrex::FArrayBox>,&mfi);
    lVar4 = (long)bx.smallend.vect[0] * 8;
    lVar13 = (long)bx.smallend.vect[2];
    local_2d4 = bx.smallend.vect[2];
    while (local_2d4 = local_2d4 + 1, (int)lVar13 <= bx.bigend.vect[2]) {
      lVar5 = (long)local_208.begin.x;
      lVar11 = (lVar13 - local_208.begin.z) * local_208.kstride;
      lVar7 = lVar13 - local_1c8.begin.z;
      lVar2 = (lVar13 - local_188.begin.z) * local_188.kstride * 8 + (long)local_188.begin.x * -8 +
              lVar4;
      lVar1 = lVar13 + 1;
      lVar14 = lVar13 - local_148.begin.z;
      lVar8 = (long)bx.smallend.vect[1];
      while (lVar13 = lVar1, lVar8 <= bx.bigend.vect[1]) {
        if (bx.bigend.vect[0] < bx.smallend.vect[0]) {
          lVar8 = lVar8 + 1;
        }
        else {
          lVar3 = (lVar8 - local_148.begin.y) * local_148.jstride * 8 +
                  lVar14 * local_148.kstride * 8 + (long)local_148.begin.x * -8 + lVar4;
          lVar10 = (lVar8 - local_208.begin.y) * local_208.jstride * 8;
          lVar6 = lVar8 - local_188.begin.y;
          lVar13 = lVar8 + 1;
          lVar9 = (lVar8 - local_1c8.begin.y) * local_1c8.jstride * 8;
          lVar12 = 0;
          do {
            *(double *)((long)local_208.p + lVar12 * 8 + lVar10 + lVar11 * 8 + lVar5 * -8 + lVar4) =
                 (*(double *)((long)local_148.p + lVar12 * 8 + lVar3) +
                 *(double *)((long)local_148.p + lVar12 * 8 + lVar3 + 8)) * 0.5;
            *(double *)
             ((long)local_208.p +
             lVar12 * 8 + lVar10 + local_208.nstride * 8 + lVar11 * 8 + lVar5 * -8 + lVar4) =
                 (*(double *)
                   ((long)local_188.p + lVar12 * 8 + lVar6 * local_188.jstride * 8 + lVar2) +
                 *(double *)
                  ((long)local_188.p +
                  lVar12 * 8 +
                  (long)((int)lVar13 - local_188.begin.y) * local_188.jstride * 8 + lVar2)) * 0.5;
            *(double *)
             ((long)local_208.p +
             lVar12 * 8 + lVar10 + local_208.nstride * 0x10 + lVar11 * 8 + lVar5 * -8 + lVar4) =
                 (*(double *)
                   ((long)local_1c8.p +
                   lVar12 * 8 +
                   lVar9 + lVar7 * local_1c8.kstride * 8 + (long)local_1c8.begin.x * -8 + lVar4) +
                 *(double *)
                  ((long)local_1c8.p +
                  lVar12 * 8 +
                  lVar9 + (long)(local_2d4 - local_1c8.begin.z) * local_1c8.kstride * 8 +
                          (long)local_1c8.begin.x * -8 + lVar4)) * 0.5;
            lVar12 = lVar12 + 1;
            lVar8 = lVar13;
          } while ((bx.bigend.vect[0] - bx.smallend.vect[0]) + 1 != (int)lVar12);
        }
      }
    }
    MFIter::operator++(&mfi);
  }
  MFIter::~MFIter(&mfi);
  return;
}

Assistant:

void average_face_to_cellcenter (MultiFab& cc,
                                     const Array<const MultiFab*,AMREX_SPACEDIM>& fc,
                                     const Geometry& geom)
    {
        AMREX_ASSERT(cc.nComp() >= AMREX_SPACEDIM);
        AMREX_ASSERT(fc[0]->nComp() == 1); // We only expect fc to have the gradient perpendicular to the face

        const GeometryData gd = geom.data();
        amrex::ignore_unused(gd);

#ifdef AMREX_USE_GPU
        if (Gpu::inLaunchRegion() && cc.isFusingCandidate()) {
            auto const& ccma = cc.arrays();
            AMREX_D_TERM(auto const& fxma = fc[0]->const_arrays();,
                         auto const& fyma = fc[1]->const_arrays();,
                         auto const& fzma = fc[2]->const_arrays(););
            ParallelFor(cc,
            [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int k) noexcept
            {
                amrex_avg_fc_to_cc(i,j,k, ccma[box_no], AMREX_D_DECL(fxma[box_no],
                                                                     fyma[box_no],
                                                                     fzma[box_no]),
                                   0
#if (AMREX_SPACEDIM == 1)
                                   , gd
#endif
                                   );
            });
            Gpu::streamSynchronize();
        } else
#endif
        {
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
            for (MFIter mfi(cc,TilingIfNotGPU()); mfi.isValid(); ++mfi)
            {
                const Box bx = mfi.tilebox();
                Array4<Real> const& ccarr = cc.array(mfi);
                AMREX_D_TERM(Array4<Real const> const& fxarr = fc[0]->const_array(mfi);,
                             Array4<Real const> const& fyarr = fc[1]->const_array(mfi);,
                             Array4<Real const> const& fzarr = fc[2]->const_array(mfi););

#if (AMREX_SPACEDIM == 1)
                AMREX_HOST_DEVICE_PARALLEL_FOR_3D( bx, i, j, k,
                {
                    amrex_avg_fc_to_cc(i,j,k, ccarr, fxarr, 0, gd);
                });
#else
                AMREX_HOST_DEVICE_PARALLEL_FOR_3D( bx, i, j, k,
                {
                    amrex_avg_fc_to_cc(i,j,k, ccarr, AMREX_D_DECL(fxarr,fyarr,fzarr), 0);
                });
#endif
            }
        }
    }